

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
bk_lib::pod_vector<Clasp::AcyclicityCheck::Parent,_std::allocator<Clasp::AcyclicityCheck::Parent>_>
::resize(pod_vector<Clasp::AcyclicityCheck::Parent,_std::allocator<Clasp::AcyclicityCheck::Parent>_>
         *this,size_type ns,Parent *val)

{
  uint uVar1;
  Parent *first;
  
  uVar1 = (this->ebo_).size;
  if (uVar1 < ns) {
    if ((this->ebo_).cap < ns) {
      append_realloc(this,ns - uVar1,val);
    }
    else {
      first = (this->ebo_).buf + uVar1;
      detail::fill<Clasp::AcyclicityCheck::Parent>(first,first + (ns - uVar1),val);
    }
  }
  (this->ebo_).size = ns;
  return;
}

Assistant:

void resize(size_type ns, const T& val = T()) {
		if (ns > size()) {
			ns <= capacity() ? detail::fill(end(), end()+(ns-size()), val) : append_realloc(ns-size(), val);
		}
		ebo_.size = ns;
	}